

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfilingHelpers.cpp
# Opt level: O0

InlineCache *
Js::ProfilingHelpers::GetInlineCache
          (ScriptFunction *scriptFunction,InlineCacheIndex inlineCacheIndex)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  FunctionBody *pFVar5;
  ScriptFunctionWithInlineCache *this;
  InlineCache *local_20;
  InlineCacheIndex inlineCacheIndex_local;
  ScriptFunction *scriptFunction_local;
  
  if (scriptFunction == (ScriptFunction *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0x5b1,"(scriptFunction)","scriptFunction");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pFVar5 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)scriptFunction);
  uVar3 = FunctionBody::GetInlineCacheCount(pFVar5);
  if (uVar3 <= inlineCacheIndex) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0x5b2,
                                "(inlineCacheIndex < scriptFunction->GetFunctionBody()->GetInlineCacheCount())"
                                ,
                                "inlineCacheIndex < scriptFunction->GetFunctionBody()->GetInlineCacheCount()"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = ScriptFunction::GetHasInlineCaches(scriptFunction);
  if (bVar2) {
    this = UnsafeVarTo<Js::ScriptFunctionWithInlineCache,Js::ScriptFunction>(scriptFunction);
    local_20 = ScriptFunctionWithInlineCache::GetInlineCache(this,inlineCacheIndex);
  }
  else {
    pFVar5 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)scriptFunction);
    local_20 = FunctionBody::GetInlineCache(pFVar5,inlineCacheIndex);
  }
  return local_20;
}

Assistant:

InlineCache *ProfilingHelpers::GetInlineCache(ScriptFunction *const scriptFunction, const InlineCacheIndex inlineCacheIndex)
    {
        Assert(scriptFunction);
        Assert(inlineCacheIndex < scriptFunction->GetFunctionBody()->GetInlineCacheCount());

        return
            scriptFunction->GetHasInlineCaches()
                ? UnsafeVarTo<ScriptFunctionWithInlineCache>(scriptFunction)->GetInlineCache(inlineCacheIndex)
                : scriptFunction->GetFunctionBody()->GetInlineCache(inlineCacheIndex);
    }